

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::resizeLike<Eigen::Matrix<int,3,1,0,3,1>>
          (PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *this,
          EigenBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *_other)

{
  Matrix<int,_3,_1,_0,_3,_1> *other;
  
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)this,3,1);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(other.rows(), other.cols());
      const Index othersize = other.rows()*other.cols();
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }